

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O0

void * TPZAnalysis::ThreadData::ThreadWork(void *datavoid)

{
  _func_int **pp_Var1;
  TPZCompEl **ppTVar2;
  int64_t iVar3;
  TPZManVector<double,_10> *pTVar4;
  double *pdVar5;
  TPZChunkVector<TPZCompEl_*,_10> *in_RDI;
  int ier;
  int nerrors;
  TPZCompEl *cel;
  int64_t iel;
  int64_t myid;
  TPZManVector<double,_10> errors;
  int64_t nelem;
  ThreadData *data;
  TPZManVector<double,_10> *in_stack_fffffffffffffed0;
  TPZManVector<double,_10> *in_stack_fffffffffffffee0;
  double in_stack_fffffffffffffee8;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_fffffffffffffef0;
  int local_d4;
  undefined8 local_d0;
  int local_c4;
  TPZCompEl *local_c0;
  TPZChunkVector<TPZCompEl_*,_10> **local_b8;
  int64_t local_b0;
  TPZChunkVector<TPZCompEl_*,_10> **local_98;
  int64_t local_90;
  TPZVec<double> local_88 [3];
  int64_t local_18;
  TPZChunkVector<TPZCompEl_*,_10> *local_10 [2];
  
  local_10[0] = in_RDI;
  local_18 = TPZChunkVector<TPZCompEl_*,_10>::NElements(in_RDI);
  TPZManVector<double,_10>::TPZManVector
            ((TPZManVector<double,_10> *)in_stack_fffffffffffffef0,
             (int64_t)in_stack_fffffffffffffee8);
  local_98 = local_10;
  local_90 = ThreadWork::anon_class_8_1_898a9ca8::operator()
                       ((anon_class_8_1_898a9ca8 *)in_stack_fffffffffffffee0);
  do {
    local_b8 = local_10;
    local_b0 = ThreadWork::anon_class_8_1_898a9ca8::operator()
                         ((anon_class_8_1_898a9ca8 *)in_stack_fffffffffffffee0);
    if (local_b0 < local_18) {
      ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (in_stack_fffffffffffffef0,(int64_t)in_stack_fffffffffffffee8);
      local_c0 = *ppTVar2;
      if (local_c0 != (TPZCompEl *)0x0) {
        (**(code **)(*(long *)local_c0 + 0x138))
                  (local_c0,local_88,
                   *(byte *)((long)&local_10[0][2].fVec.super_TPZVec<TPZCompEl_**>.fNElements + 4) &
                   1);
        iVar3 = TPZVec<double>::NElements(local_88);
        local_c4 = (int)iVar3;
        pTVar4 = TPZVec<TPZManVector<double,_10>_>::operator[]
                           ((TPZVec<TPZManVector<double,_10>_> *)
                            &local_10[0][2].fVec.super_TPZVec<TPZCompEl_**>.fNAlloc,local_90);
        local_d0 = 0;
        (*(pTVar4->super_TPZVec<double>)._vptr_TPZVec[2])(pTVar4,(long)local_c4,&local_d0);
        for (local_d4 = 0; local_d4 < local_c4; local_d4 = local_d4 + 1) {
          pdVar5 = TPZVec<double>::operator[](local_88,(long)local_d4);
          in_stack_fffffffffffffee8 = *pdVar5;
          in_stack_fffffffffffffef0 =
               (TPZChunkVector<TPZCompEl_*,_10> *)
               TPZVec<double>::operator[](local_88,(long)local_d4);
          pp_Var1 = ((TPZVec<double> *)&in_stack_fffffffffffffef0->super_TPZSavable)->_vptr_TPZVec;
          in_stack_fffffffffffffee0 =
               TPZVec<TPZManVector<double,_10>_>::operator[]
                         ((TPZVec<TPZManVector<double,_10>_> *)
                          &local_10[0][2].fVec.super_TPZVec<TPZCompEl_**>.fNAlloc,local_90);
          in_stack_fffffffffffffed0 =
               (TPZManVector<double,_10> *)
               TPZVec<double>::operator[]
                         (&in_stack_fffffffffffffee0->super_TPZVec<double>,(long)local_d4);
          (in_stack_fffffffffffffed0->super_TPZVec<double>)._vptr_TPZVec =
               (_func_int **)
               (in_stack_fffffffffffffee8 * (double)pp_Var1 +
               (double)(in_stack_fffffffffffffed0->super_TPZVec<double>)._vptr_TPZVec);
        }
      }
    }
  } while ((long)local_10[0][2].fVec.super_TPZVec<TPZCompEl_**>.fStore < local_18);
  TPZManVector<double,_10>::~TPZManVector(in_stack_fffffffffffffed0);
  return local_10[0];
}

Assistant:

void *TPZAnalysis::ThreadData::ThreadWork(void *datavoid)
{
  ThreadData *data = (ThreadData *) datavoid;
  const int64_t nelem = data->fElvec.NElements();
  TPZManVector<REAL,10> errors(10);
 
  // Getting unique id for each thread
  const int64_t myid = [&]()
  {
    std::scoped_lock lock(data->fMutexThreadId);
    const int64_t myid_loc = data->ftid;
    data->ftid++;
    return myid_loc;
  }();

  
  
  do{

    const int64_t iel = [&]()
    {
      std::scoped_lock lock(data->fMutexAccessEl);
      const int64_t iel_loc = data->fNextElement;
      data->fNextElement++;
      return iel_loc;
    }();
    
    // For all the elements it tries to get after the last one
    if ( iel >= nelem ) continue;
    
    TPZCompEl *cel = data->fElvec[iel];

    if(!cel) continue;
    
    cel->EvaluateError(errors, data->fStoreError);
    
    const int nerrors = errors.NElements();
    data->fvalues[myid].Resize(nerrors, 0.);


    for(int ier = 0; ier < nerrors; ier++)
    {
      (data->fvalues[myid])[ier] += errors[ier] * errors[ier];
    }
    
    
  } while (data->fNextElement < nelem);
  return data;
}